

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

int __thiscall IDisk::CreateUnformattedTrack(IDisk *this,int side,int track)

{
  uchar *puVar1;
  int local_20;
  int i;
  int size;
  int track_local;
  int side_local;
  IDisk *this_local;
  
  this->side_[side].tracks[track].size = 100000;
  puVar1 = (uchar *)operator_new__((ulong)(this->side_[side].tracks[track].size + 0x20));
  this->side_[side].tracks[track].bitfield = puVar1;
  for (local_20 = 0; local_20 < 100000; local_20 = local_20 + 1) {
    this->side_[side].tracks[track].bitfield[local_20] = '\x04';
  }
  return 100000;
}

Assistant:

int IDisk::CreateUnformattedTrack(int side, int track)
{
   // todo
   int size = 100000;
   if (size != 0)
   {
      side_[side].tracks[track].size = size;
      side_[side].tracks[track].bitfield = new unsigned char[side_[side].tracks[track].size + 32];

      for (int i = 0; i < size; i++)
      {
         side_[side].tracks[track].bitfield[i] = BIT_WEAK;
      }
   }

   return size;
}